

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processConfig.cpp
# Opt level: O3

void __thiscall CommandWrite::CommandWrite(CommandWrite *this,string *stream,string *group)

{
  pointer pcVar1;
  
  (this->super_Command).op = Write;
  (this->super_Command).conditionalStream._M_dataplus._M_p =
       (pointer)&(this->super_Command).conditionalStream.field_2;
  (this->super_Command).conditionalStream._M_string_length = 0;
  (this->super_Command).conditionalStream.field_2._M_local_buf[0] = '\0';
  (this->super_Command)._vptr_Command = (_func_int **)&PTR__CommandWrite_001258f8;
  (this->streamName)._M_dataplus._M_p = (pointer)&(this->streamName).field_2;
  pcVar1 = (stream->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->streamName,pcVar1,pcVar1 + stream->_M_string_length);
  (this->groupName)._M_dataplus._M_p = (pointer)&(this->groupName).field_2;
  pcVar1 = (group->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->groupName,pcVar1,pcVar1 + group->_M_string_length);
  (this->variables).
  super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->variables).
  super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->variables).
  super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

CommandWrite::CommandWrite(std::string stream, std::string group)
: Command(Operation::Write), streamName(stream), groupName(group)
{
}